

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v8::detail::print(detail *this,FILE *f,string_view text)

{
  char *ptr;
  size_t count;
  FILE *f_local;
  string_view text_local;
  
  text_local.data_ = text.data_;
  f_local = f;
  ptr = basic_string_view<char>::data((basic_string_view<char> *)&f_local);
  count = basic_string_view<char>::size((basic_string_view<char> *)&f_local);
  fwrite_fully(ptr,1,count,(FILE *)this);
  return;
}

Assistant:

FMT_FUNC void print(std::FILE* f, string_view text) {
#ifdef _WIN32
  auto fd = _fileno(f);
  if (_isatty(fd)) {
    detail::utf8_to_utf16 u16(string_view(text.data(), text.size()));
    auto written = detail::dword();
    if (detail::WriteConsoleW(reinterpret_cast<void*>(_get_osfhandle(fd)),
                              u16.c_str(), static_cast<uint32_t>(u16.size()),
                              &written, nullptr)) {
      return;
    }
    // Fallback to fwrite on failure. It can happen if the output has been
    // redirected to NUL.
  }
#endif
  detail::fwrite_fully(text.data(), 1, text.size(), f);
}